

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void EDCircles::jacobi(double **a,int n,double *d,double **v,int nrot)

{
  undefined8 uVar1;
  double dVar2;
  double *pdVar3;
  void *__s;
  void *__s_00;
  long lVar4;
  long lVar5;
  int l;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int j;
  uint j_00;
  int i;
  size_t __n;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ulong local_80;
  
  __n = (long)(int)(n + 1U) << 3;
  uVar6 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar6 = __n;
  }
  __s = operator_new__(uVar6);
  __s_00 = operator_new__(uVar6);
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  uVar8 = 0;
  if (0 < n) {
    uVar8 = n;
  }
  for (uVar6 = 1; uVar6 != uVar8 + 1; uVar6 = uVar6 + 1) {
    pdVar3 = v[uVar6];
    for (uVar7 = 1; n + 1U != uVar7; uVar7 = uVar7 + 1) {
      pdVar3[uVar7] = 0.0;
    }
    pdVar3[uVar6] = 1.0;
  }
  for (lVar5 = 0; (ulong)uVar8 * 8 - lVar5 != 0; lVar5 = lVar5 + 8) {
    uVar1 = *(undefined8 *)(*(long *)((long)a + lVar5 + 8) + 8 + lVar5);
    *(undefined8 *)((long)d + lVar5 + 8) = uVar1;
    *(undefined8 *)((long)__s + lVar5 + 8) = uVar1;
    *(undefined8 *)((long)__s_00 + lVar5 + 8) = 0;
  }
  for (uVar9 = 1; uVar9 != 0x33; uVar9 = uVar9 + 1) {
    dVar14 = 0.0;
    lVar5 = 2;
    for (lVar4 = 1; lVar10 = lVar5, lVar4 < n; lVar4 = lVar4 + 1) {
      for (; (int)lVar10 <= n; lVar10 = lVar10 + 1) {
        dVar14 = dVar14 + ABS(a[lVar4][lVar10]);
      }
      lVar5 = lVar5 + 1;
    }
    if ((dVar14 == 0.0) && (!NAN(dVar14))) break;
    if (uVar9 < 4) {
      dVar14 = (dVar14 * 0.2) / (double)(n * n);
    }
    else {
      dVar14 = 0.0;
    }
    lVar4 = 0;
    local_80 = 2;
    lVar5 = 1;
    while (lVar5 < n) {
      for (uVar6 = local_80; l = (int)uVar6, l <= n; uVar6 = uVar6 + 1) {
        pdVar3 = a[lVar5];
        dVar11 = pdVar3[uVar6];
        dVar12 = ABS(dVar11) * 100.0;
        if (((uVar9 < 5) || (dVar12 != 0.0)) || (NAN(dVar12))) {
          if (dVar14 < ABS(dVar11)) {
            dVar2 = d[lVar5];
            dVar13 = d[uVar6] - dVar2;
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              dVar12 = (dVar13 * 0.5) / dVar11;
              dVar13 = 1.0 / (SQRT(dVar12 * dVar12 + 1.0) + ABS(dVar12));
              if (dVar12 < 0.0) {
                dVar13 = -dVar13;
              }
            }
            else {
              dVar13 = dVar11 / dVar13;
            }
            dVar15 = 1.0 / SQRT(dVar13 * dVar13 + 1.0);
            dVar12 = dVar13 * dVar15;
            dVar15 = dVar12 / (dVar15 + 1.0);
            dVar11 = dVar11 * dVar13;
            *(double *)((long)__s_00 + lVar5 * 8) = *(double *)((long)__s_00 + lVar5 * 8) - dVar11;
            *(double *)((long)__s_00 + uVar6 * 8) = *(double *)((long)__s_00 + uVar6 * 8) + dVar11;
            d[lVar5] = dVar2 - dVar11;
            d[uVar6] = dVar11 + d[uVar6];
            pdVar3[uVar6] = 0.0;
            lVar10 = 0;
            while (j = (int)lVar5, uVar7 = local_80, lVar4 != lVar10) {
              lVar10 = lVar10 + 1;
              ROTATE(a,(int)lVar10,j,(int)lVar10,l,dVar15,dVar12);
            }
            for (; uVar7 < uVar6; uVar7 = uVar7 + 1) {
              ROTATE(a,j,(int)uVar7,(int)uVar7,l,dVar15,dVar12);
            }
            uVar7 = uVar6 & 0xffffffff;
            while ((int)uVar7 < n) {
              j_00 = (int)uVar7 + 1;
              ROTATE(a,j,j_00,l,j_00,dVar15,dVar12);
              uVar7 = (ulong)j_00;
            }
            for (i = 1; i - n != 1; i = i + 1) {
              ROTATE(v,i,j,i,l,dVar15,dVar12);
            }
          }
        }
        else {
          pdVar3[uVar6] = 0.0;
        }
      }
      local_80 = local_80 + 1;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 1;
    }
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      dVar14 = *(double *)((long)__s_00 + uVar6 * 8 + 8) + *(double *)((long)__s + uVar6 * 8 + 8);
      *(double *)((long)__s + uVar6 * 8 + 8) = dVar14;
      d[uVar6 + 1] = dVar14;
      *(undefined8 *)((long)__s_00 + uVar6 * 8 + 8) = 0;
    }
  }
  operator_delete__(__s);
  operator_delete__(__s_00);
  return;
}

Assistant:

void EDCircles::jacobi(double ** a, int n, double d[], double ** v, int nrot)
{
	int j, iq, ip, i;
	double tresh, theta, tau, t, sm, s, h, g, c;

	double *b = new double[n + 1];
	double *z = new double[n + 1];
	memset(b, 0, sizeof(double)*(n + 1));
	memset(z, 0, sizeof(double)*(n + 1));

	for (ip = 1; ip <= n; ip++)
	{
		for (iq = 1; iq <= n; iq++) v[ip][iq] = 0.0;
		v[ip][ip] = 1.0;
	}
	for (ip = 1; ip <= n; ip++)
	{
		b[ip] = d[ip] = a[ip][ip];
		z[ip] = 0.0;
	}
	nrot = 0;
	for (i = 1; i <= 50; i++)
	{
		sm = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
				sm += fabs(a[ip][iq]);
		}
		if (sm == 0.0)
		{
			delete[] b;
			delete[] z;
			return;
		}
		if (i < 4)
			tresh = 0.2 * sm / (n * n);
		else
			tresh = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
			{
				g = 100.0 * fabs(a[ip][iq]);
				//				if (i > 4 && fabs(d[ip]) + g == fabs(d[ip])
				//				&& fabs(d[iq]) + g == fabs(d[iq]))

				if (i > 4 && g == 0.0)
					a[ip][iq] = 0.0;
				else if (fabs(a[ip][iq]) > tresh)
				{
					h = d[iq] - d[ip];
					if (g == 0.0)
						t = (a[ip][iq]) / h;
					else
					{
						theta = 0.5 * h / (a[ip][iq]);
						t = 1.0 / (fabs(theta) + sqrt(1.0 + theta * theta));
						if (theta < 0.0) t = -t;
					}
					c = 1.0 / sqrt(1 + t * t);
					s = t * c;
					tau = s / (1.0 + c);
					h = t * a[ip][iq];
					z[ip] -= h;
					z[iq] += h;
					d[ip] -= h;
					d[iq] += h;
					a[ip][iq] = 0.0;
					for (j = 1; j <= ip - 1; j++)
					{
						ROTATE(a, j, ip, j, iq, tau, s);
					}
					for (j = ip + 1; j <= iq - 1; j++)
					{
						ROTATE(a, ip, j, j, iq, tau, s);
					}
					for (j = iq + 1; j <= n; j++)
					{
						ROTATE(a, ip, j, iq, j, tau, s);
					}
					for (j = 1; j <= n; j++)
					{
						ROTATE(v, j, ip, j, iq, tau, s);
					}
					++nrot;
				}
			}
		}
		for (ip = 1; ip <= n; ip++)
		{
			b[ip] += z[ip];
			d[ip] = b[ip];
			z[ip] = 0.0;
		}
	}
	//printf("Too many iterations in routine JACOBI");
	delete[] b;
	delete[] z;
}